

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int exprCompareVariable(Parse *pParse,Expr *pVar,Expr *pExpr)

{
  int iVar1;
  sqlite3_value *local_38;
  sqlite3_value *pR;
  sqlite3_value *pL;
  int iVar;
  int res;
  Expr *pExpr_local;
  Expr *pVar_local;
  Parse *pParse_local;
  
  pL._4_4_ = 0;
  local_38 = (Mem *)0x0;
  _iVar = pExpr;
  pExpr_local = pVar;
  pVar_local = (Expr *)pParse;
  sqlite3ValueFromExpr(pParse->db,pExpr,'\x01','A',&local_38);
  if (local_38 != (Mem *)0x0) {
    pL._0_4_ = (int)pExpr_local->iColumn;
    sqlite3VdbeSetVarmask((Vdbe *)pVar_local->pLeft,(int)pL);
    pR = sqlite3VdbeGetBoundValue((Vdbe *)pVar_local[4].pLeft,(int)pL,'A');
    if (pR != (sqlite3_value *)0x0) {
      iVar1 = sqlite3_value_type(pR);
      if (iVar1 == 3) {
        sqlite3_value_text(pR);
      }
      iVar1 = sqlite3MemCompare(pR,local_38,(CollSeq *)0x0);
      pL._4_4_ = (uint)(iVar1 == 0);
    }
    sqlite3ValueFree(local_38);
    sqlite3ValueFree(pR);
  }
  return pL._4_4_;
}

Assistant:

static int exprCompareVariable(Parse *pParse, Expr *pVar, Expr *pExpr){
  int res = 0;
  int iVar;
  sqlite3_value *pL, *pR = 0;
  
  sqlite3ValueFromExpr(pParse->db, pExpr, SQLITE_UTF8, SQLITE_AFF_BLOB, &pR);
  if( pR ){
    iVar = pVar->iColumn;
    sqlite3VdbeSetVarmask(pParse->pVdbe, iVar);
    pL = sqlite3VdbeGetBoundValue(pParse->pReprepare, iVar, SQLITE_AFF_BLOB);
    if( pL ){
      if( sqlite3_value_type(pL)==SQLITE_TEXT ){
        sqlite3_value_text(pL); /* Make sure the encoding is UTF-8 */
      }
      res =  0==sqlite3MemCompare(pL, pR, 0);
    }
    sqlite3ValueFree(pR);
    sqlite3ValueFree(pL);
  }

  return res;
}